

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O0

void __thiscall
nite::FileTransfer::UDPClient::request
          (UDPClient *this,IP_Port *client,string *hash,string *output,FTCallback *callback,
          bool overwrite)

{
  Packet *this_00;
  FTCallback *callback_00;
  string *ip;
  bool bVar1;
  Indexer *this_01;
  IndexedFile *file_00;
  size_t __n;
  void *__buf;
  void *__buf_00;
  int __flags;
  UDPClient *pUVar2;
  string local_3c0 [32];
  string local_3a0 [39];
  allocator local_379;
  string local_378;
  undefined1 local_358 [8];
  string id;
  Packet request;
  IndexedFile *file;
  Indexer *indexer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  byte local_31;
  FTCallback *pFStack_30;
  bool overwrite_local;
  FTCallback *callback_local;
  string *output_local;
  string *hash_local;
  IP_Port *client_local;
  UDPClient *this_local;
  
  local_31 = overwrite;
  pFStack_30 = callback;
  callback_local = (FTCallback *)output;
  output_local = hash;
  hash_local = &client->ip;
  client_local = (IP_Port *)this;
  if (((this->sock).opened & 1U) == 0) {
    std::operator+(&local_78,"failed to request file \'",hash);
    std::operator+(&local_58,&local_78,"\' from server: socket is not open. run listen() first");
    print(&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
  }
  else {
    bVar1 = fileExists(output);
    if (bVar1) {
      if ((local_31 & 1) == 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&indexer
                       ,"cannot request FT to output to \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       callback_local);
        std::operator+(&local_a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&indexer
                       ,"\': it already exists and overwritting is not allowed");
        print(&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::~string((string *)&indexer);
        return;
      }
      removeFile((string *)callback_local);
    }
    this_01 = getIndexer();
    file_00 = Indexer::indexGhostFile(this_01,(string *)callback_local,output_local);
    this_00 = (Packet *)((long)&id.field_2 + 8);
    Packet::Packet(this_00);
    Packet::setHeader(this_00,0);
    ip = hash_local;
    callback_00 = pFStack_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_378,"",&local_379);
    __n = 0;
    pUVar2 = this;
    initFTSession((string *)local_358,file_00,(IP_Port *)ip,false,this,callback_00,&local_378);
    __flags = (int)pUVar2;
    std::__cxx11::string::~string((string *)&local_378);
    std::allocator<char>::~allocator((allocator<char> *)&local_379);
    std::__cxx11::string::string(local_3a0,(string *)output_local);
    Packet::write((Packet *)((long)&id.field_2 + 8),(int)local_3a0,__buf,__n);
    std::__cxx11::string::~string(local_3a0);
    std::__cxx11::string::string(local_3c0,(string *)local_358);
    Packet::write((Packet *)((long)&id.field_2 + 8),(int)local_3c0,__buf_00,__n);
    std::__cxx11::string::~string(local_3c0);
    UDPSocket::send(&this->sock,(int)hash_local,(void *)((long)&id.field_2 + 8),__n,__flags);
    std::__cxx11::string::~string((string *)local_358);
    Packet::~Packet((Packet *)((long)&id.field_2 + 8));
  }
  return;
}

Assistant:

void nite::FileTransfer::UDPClient::request(	const nite::IP_Port &client,
												const String &hash, 
												const String &output, 
												const nite::FileTransfer::FTCallback &callback,
												bool overwrite){
	if(!sock.opened){
		nite::print("failed to request file '"+hash+"' from server: socket is not open. run listen() first");
		return;
	}
	if(nite::fileExists(output)){
		if(overwrite){
			nite::removeFile(output);
		}else{
			nite::print("cannot request FT to output to '"+output+"': it already exists and overwritting is not allowed");
			return;
		}
	}
	auto indexer = nite::getIndexer();
	auto file = indexer->indexGhostFile(output, hash);
	nite::Packet request;
	request.setHeader(FTHeader::REQUEST);
	auto id = initFTSession(*file, client, false, this, callback);
	request.write(hash);
	request.write(id);
	sock.send(client, request);
}